

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

void __thiscall
slang::TypedBumpAllocator<slang::analysis::AnalyzedScope>::~TypedBumpAllocator
          (TypedBumpAllocator<slang::analysis::AnalyzedScope> *this)

{
  AnalyzedScope *this_00;
  Segment *pSVar1;
  
  pSVar1 = (Segment *)this;
  while (pSVar1 = ((BumpAllocator *)&pSVar1->prev)->head, pSVar1 != (Segment *)0x0) {
    for (this_00 = (AnalyzedScope *)(pSVar1 + 1); this_00 != (AnalyzedScope *)pSVar1->current;
        this_00 = this_00 + 1) {
      analysis::AnalyzedScope::~AnalyzedScope(this_00);
    }
  }
  BumpAllocator::~BumpAllocator(&this->super_BumpAllocator);
  return;
}

Assistant:

~TypedBumpAllocator() {
        Segment* seg = head;
        while (seg) {
            for (T* cur = (T*)(seg + 1); cur != (T*)seg->current; cur++)
                cur->~T();
            seg = seg->prev;
        }
    }